

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O2

fio_str_info_s *
fio_str_vprintf(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,char *format,
               __va_list_tag *argv)

{
  uint uVar1;
  size_t sVar2;
  va_list argv_cpy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  local_38 = argv->reg_save_area;
  local_48._0_4_ = argv->gp_offset;
  local_48._4_4_ = argv->fp_offset;
  pvStack_40 = argv->overflow_arg_area;
  uVar1 = vsnprintf((char *)0x0,0,format,&local_48);
  if ((int)uVar1 < 1) {
    fio_str_info(__return_storage_ptr__,s);
  }
  else {
    sVar2 = fio_str_len(s);
    fio_str_resize(__return_storage_ptr__,s,sVar2 + uVar1);
    vsnprintf(__return_storage_ptr__->data + (__return_storage_ptr__->len - (ulong)uVar1),
              (ulong)(uVar1 + 1),format,argv);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_FUNC __attribute__((format(printf, 2, 0))) fio_str_info_s
fio_str_vprintf(fio_str_s *s, const char *format, va_list argv) {
  va_list argv_cpy;
  va_copy(argv_cpy, argv);
  int len = vsnprintf(NULL, 0, format, argv_cpy);
  va_end(argv_cpy);
  if (len <= 0)
    return fio_str_info(s);
  fio_str_info_s state = fio_str_resize(s, len + fio_str_len(s));
  vsnprintf(state.data + (state.len - len), len + 1, format, argv);
  return state;
}